

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls.c
# Opt level: O0

_Bool HMAC_Validate(COSE_MacMessage *pcose,int HSize,int TSize,byte *pbKey,size_t cbKey,
                   byte *pbAuthData,size_t cbAuthData,cose_errback *perr)

{
  byte bVar1;
  int iVar2;
  mbedtls_md_info_t *md_info;
  cn_cbor *pcVar3;
  bool bVar4;
  cn_cbor *cn;
  uint i;
  _Bool f;
  uchar *puStack_68;
  uint cbOut;
  byte *rgbOut;
  mbedtls_md_info_t *info;
  char *md_name;
  mbedtls_md_context_t contx;
  byte *pbAuthData_local;
  size_t cbKey_local;
  byte *pbKey_local;
  int TSize_local;
  int HSize_local;
  COSE_MacMessage *pcose_local;
  
  puStack_68 = (uchar *)0x0;
  bVar4 = false;
  contx.hmac_ctx = pbAuthData;
  if (HSize == 0x100) {
    info = (mbedtls_md_info_t *)0x3483e0;
  }
  else if (HSize == 0x180) {
    info = (mbedtls_md_info_t *)0x344f8f;
  }
  else {
    if (HSize != 0x200) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
      goto LAB_00262351;
    }
    info = (mbedtls_md_info_t *)anon_var_dwarf_23ad97;
  }
  mbedtls_md_init((mbedtls_md_context_t *)&md_name);
  md_info = mbedtls_md_info_from_string((char *)info);
  mbedtls_md_setup((mbedtls_md_context_t *)&md_name,md_info,1);
  bVar1 = mbedtls_md_get_size(md_info);
  puStack_68 = (uchar *)calloc((ulong)(uint)bVar1,1);
  if (puStack_68 == (uchar *)0x0) {
    if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_OUT_OF_MEMORY;
    }
  }
  else {
    iVar2 = mbedtls_md_hmac_starts((mbedtls_md_context_t *)&md_name,pbKey,cbKey);
    if (iVar2 == 0) {
      iVar2 = mbedtls_md_hmac_update
                        ((mbedtls_md_context_t *)&md_name,(uchar *)contx.hmac_ctx,cbAuthData);
      if (iVar2 == 0) {
        iVar2 = mbedtls_md_hmac_finish((mbedtls_md_context_t *)&md_name,puStack_68);
        if (iVar2 == 0) {
          pcVar3 = _COSE_arrayget_int(&pcose->m_message,3);
          if (pcVar3 != (cn_cbor *)0x0) {
            if ((int)(uint)bVar1 < pcVar3->length) {
              return false;
            }
            for (cn._4_4_ = 0; cn._4_4_ < (uint)TSize >> 3; cn._4_4_ = cn._4_4_ + 1) {
              bVar4 = bVar4 != false || (pcVar3->v).bytes[cn._4_4_] != puStack_68[cn._4_4_];
            }
            mbedtls_md_free((mbedtls_md_context_t *)&md_name);
            return (_Bool)(bVar4 ^ 1);
          }
          if (perr != (cose_errback *)0x0) {
            perr->err = COSE_ERR_CBOR;
          }
        }
        else if (perr != (cose_errback *)0x0) {
          perr->err = COSE_ERR_CRYPTO_FAIL;
        }
      }
      else if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_CRYPTO_FAIL;
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_CRYPTO_FAIL;
    }
  }
LAB_00262351:
  free(puStack_68);
  mbedtls_md_free((mbedtls_md_context_t *)&md_name);
  return false;
}

Assistant:

bool HMAC_Validate(COSE_MacMessage * pcose, int HSize, int TSize, const byte * pbKey, size_t cbKey, const byte * pbAuthData, size_t cbAuthData, cose_errback * perr)
{
	mbedtls_md_context_t contx;
	const char* md_name;
	const struct mbedtls_md_info_t * info;
	byte * rgbOut = NULL;
	unsigned int cbOut;
	bool f = false;
	unsigned int i;

#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = &pcose->m_message.m_allocContext;
#endif

	switch (HSize) {
		case 256: md_name = "SHA256"; break;
		case 384: md_name = "SHA384"; break;
		case 512: md_name = "SHA512"; break;
		default: FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER); break;
	}

	mbedtls_md_init(&contx);
	info = mbedtls_md_info_from_string (md_name);
	mbedtls_md_setup( &contx, info, 1 );
	
	cbOut = mbedtls_md_get_size(info);
	rgbOut = COSE_CALLOC(cbOut, 1, context);
	CHECK_CONDITION(rgbOut != NULL, COSE_ERR_OUT_OF_MEMORY);

	CHECK_CONDITION(!(mbedtls_md_hmac_starts (&contx, pbKey, cbKey)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_update (&contx, pbAuthData, cbAuthData)), COSE_ERR_CRYPTO_FAIL);
	CHECK_CONDITION(!(mbedtls_md_hmac_finish (&contx, rgbOut)), COSE_ERR_CRYPTO_FAIL);

	cn_cbor * cn = _COSE_arrayget_int(&pcose->m_message, INDEX_MAC_TAG);
	CHECK_CONDITION(cn != NULL, COSE_ERR_CBOR);

	if (cn->length > (int) cbOut) return false;
	for (i = 0; i < (unsigned int) TSize/8; i++) f |= (cn->v.bytes[i] != rgbOut[i]);

	mbedtls_md_free(&contx); 
	return !f;

errorReturn:
	COSE_FREE(rgbOut, context);
	mbedtls_md_free(&contx); 
	return false;
}